

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMaterial
          (AMFImporter *this,CAMFImporter_NodeElement_Material *pMaterial)

{
  value_type pCVar1;
  bool bVar2;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *this_00;
  reference ppCVar3;
  value_type local_a8;
  value_type local_a0;
  CAMFImporter_NodeElement *mat_child;
  const_iterator __end1;
  const_iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  undefined1 local_70 [8];
  SPP_Material new_mat;
  CAMFImporter_NodeElement_Material *pMaterial_local;
  AMFImporter *this_local;
  
  new_mat.Composition.
  super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
  ._M_impl._M_node._M_size = (size_t)pMaterial;
  SPP_Material::SPP_Material((SPP_Material *)local_70);
  std::__cxx11::string::operator=
            ((string *)local_70,
             (string *)
             (new_mat.Composition.
              super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
              ._M_impl._M_node._M_size + 0x10));
  this_00 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)
            (new_mat.Composition.
             super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
             ._M_impl._M_node._M_size + 0x38);
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (this_00);
  mat_child = (CAMFImporter_NodeElement *)
              std::__cxx11::
              list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                        (this_00);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&mat_child), bVar2) {
    ppCVar3 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    local_a0 = (value_type)*ppCVar3;
    pCVar1 = local_a0;
    if (((local_a0->super_CAMFImporter_NodeElement).Type != ENET_Color) &&
       (pCVar1 = (value_type)
                 new_mat.Metadata.
                 super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                 ._M_impl._M_node._M_size,
       (local_a0->super_CAMFImporter_NodeElement).Type == ENET_Metadata)) {
      local_a8 = local_a0;
      std::__cxx11::
      list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      ::push_back((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                   *)((long)&new_mat.ID.field_2 + 8),&local_a8);
      pCVar1 = (value_type)
               new_mat.Metadata.
               super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
               ._M_impl._M_node._M_size;
    }
    new_mat.Metadata.
    super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
    ._M_impl._M_node._M_size = (size_t)pCVar1;
    std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  }
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>::
  push_back(&this->mMaterial_Converted,(value_type *)local_70);
  SPP_Material::~SPP_Material((SPP_Material *)local_70);
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildMaterial(const CAMFImporter_NodeElement_Material& pMaterial)
{
SPP_Material new_mat;

	new_mat.ID = pMaterial.ID;
	for(const CAMFImporter_NodeElement* mat_child: pMaterial.Child)
	{
		if(mat_child->Type == CAMFImporter_NodeElement::ENET_Color)
		{
			new_mat.Color = (CAMFImporter_NodeElement_Color*)mat_child;
		}
		else if(mat_child->Type == CAMFImporter_NodeElement::ENET_Metadata)
		{
			new_mat.Metadata.push_back((CAMFImporter_NodeElement_Metadata*)mat_child);
		}
	}// for(const CAMFImporter_NodeElement* mat_child; pMaterial.Child)

	// place converted material to special list
	mMaterial_Converted.push_back(new_mat);
}